

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pm_column_tests.h
# Opt level: O3

void column_test_row_access_constructors<Gudhi::persistence_matrix::Intrusive_list_column<Column_mini_matrix<Chain_col_options<false,(Gudhi::persistence_matrix::Column_types)7,true,true,true>>>,std::map<unsigned_int,boost::intrusive::list<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Chain_col_options<false,(Gudhi::persistence_matrix::Column_types)7,true,true,true>>>,boost::intrusive::constant_time_size<false>,boost::intrusive::base_hook<boost::intrusive::list_base_hook<boost::intrusive::tag<Column_mini_matrix<Chain_col_options<false,(Gudhi::persistence_matrix::Column_types)7,true,true,true>>::Matrix_row_tag>,boost::intrusive::link_mode<(boost::intrusive::link_mode_type)2>>>>,std::less<unsigned_int>,std::allocator<std::pair<unsigned_int_const,boost::intrusive::list<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Chain_col_options<false,(Gudhi::persistence_matrix::Column_types)7,true,true,true>>>,boost::intrusive::constant_time_size<false>,boost::intrusive::base_hook<boost::intrusive::list_base_hook<boost::intrusive::tag<Column_mini_matrix<Chain_col_options<false,(Gudhi::persistence_matrix::Column_types)7,true,true,true>>::Matrix_row_tag>,boost::intrusive::link_mode<(boost::intrusive::link_mode_type)2>>>>>>>>
               (vector<Gudhi::persistence_matrix::Intrusive_list_column<Column_mini_matrix<Chain_col_options<false,_(Gudhi::persistence_matrix::Column_types)7,_true,_true,_true>_>_>,_std::allocator<Gudhi::persistence_matrix::Intrusive_list_column<Column_mini_matrix<Chain_col_options<false,_(Gudhi::persistence_matrix::Column_types)7,_true,_true,_true>_>_>_>_>
                *matrix,map<unsigned_int,_boost::intrusive::list<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Chain_col_options<false,_(Gudhi::persistence_matrix::Column_types)7,_true,_true,_true>_>_>,_boost::intrusive::constant_time_size<false>,_boost::intrusive::base_hook<boost::intrusive::list_base_hook<boost::intrusive::tag<Column_mini_matrix<Chain_col_options<false,_(Gudhi::persistence_matrix::Column_types)7,_true,_true,_true>_>::Matrix_row_tag>,_boost::intrusive::link_mode<(boost::intrusive::link_mode_type)2>_>_>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_boost::intrusive::list<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Chain_col_options<false,_(Gudhi::persistence_matrix::Column_types)7,_true,_true,_true>_>_>,_boost::intrusive::constant_time_size<false>,_boost::intrusive::base_hook<boost::intrusive::list_base_hook<boost::intrusive::tag<Column_mini_matrix<Chain_col_options<false,_(Gudhi::persistence_matrix::Column_types)7,_true,_true,_true>_>::Matrix_row_tag>,_boost::intrusive::link_mode<(boost::intrusive::link_mode_type)2>_>_>_>_>_>_>
                        *rows)

{
  _Rb_tree_header *p_Var1;
  ID_index IVar2;
  _Rb_tree_color _Var3;
  int iVar4;
  pointer pIVar5;
  _Base_ptr p_Var6;
  node_ptr plVar7;
  node_ptr *pplVar8;
  uint uVar9;
  Index IVar10;
  ulong uVar11;
  bool bVar12;
  node_ptr to_erase;
  reference value;
  list_impl<boost::intrusive::bhtraits<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Chain_col_options<false,_(Gudhi::persistence_matrix::Column_types)7,_true,_true,_true>_>_>,_boost::intrusive::list_node_traits<void_*>,_(boost::intrusive::link_mode_type)2,_Column_mini_matrix<Chain_col_options<false,_(Gudhi::persistence_matrix::Column_types)7,_true,_true,_true>_>::Matrix_row_tag,_1U>,_unsigned_long,_false,_void>
  *this;
  _Rb_tree_node_base *p_Var13;
  long lVar14;
  const_node_ptr p;
  node_ptr plVar15;
  long *plVar16;
  node_ptr plVar17;
  undefined4 local_2a4;
  undefined *local_2a0;
  undefined4 *local_298;
  undefined **local_290;
  undefined **local_288;
  char *local_280;
  shared_count sStack_278;
  char *local_270;
  undefined **local_268;
  ulong local_260;
  shared_count sStack_258;
  undefined4 **local_250;
  Delete_disposer local_248;
  undefined1 local_240;
  undefined8 *local_238;
  undefined ***local_230;
  char *local_228;
  char *local_220;
  shared_count sStack_218;
  undefined4 **local_210;
  char *local_208;
  map<unsigned_int,_boost::intrusive::list<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Chain_col_options<false,_(Gudhi::persistence_matrix::Column_types)7,_true,_true,_true>_>_>,_boost::intrusive::constant_time_size<false>,_boost::intrusive::base_hook<boost::intrusive::list_base_hook<boost::intrusive::tag<Column_mini_matrix<Chain_col_options<false,_(Gudhi::persistence_matrix::Column_types)7,_true,_true,_true>_>::Matrix_row_tag>,_boost::intrusive::link_mode<(boost::intrusive::link_mode_type)2>_>_>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_boost::intrusive::list<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Chain_col_options<false,_(Gudhi::persistence_matrix::Column_types)7,_true,_true,_true>_>_>,_boost::intrusive::constant_time_size<false>,_boost::intrusive::base_hook<boost::intrusive::list_base_hook<boost::intrusive::tag<Column_mini_matrix<Chain_col_options<false,_(Gudhi::persistence_matrix::Column_types)7,_true,_true,_true>_>::Matrix_row_tag>,_boost::intrusive::link_mode<(boost::intrusive::link_mode_type)2>_>_>_>_>_>_>
  *local_200;
  undefined1 local_1f8 [16];
  _Base_ptr p_Stack_1e8;
  Index local_1e0;
  _Base_ptr local_1d8;
  Entry_constructor *pEStack_1d0;
  list_node<void_*> local_1c8;
  undefined1 local_1b8 [24];
  undefined4 ***local_1a0;
  _Base_ptr local_198;
  Entry_constructor *pEStack_190;
  list_node<void_*> local_188;
  vector<Gudhi::persistence_matrix::Intrusive_list_column<Column_mini_matrix<Chain_col_options<false,_(Gudhi::persistence_matrix::Column_types)7,_true,_true,_true>_>_>,_std::allocator<Gudhi::persistence_matrix::Intrusive_list_column<Column_mini_matrix<Chain_col_options<false,_(Gudhi::persistence_matrix::Column_types)7,_true,_true,_true>_>_>_>_>
  *local_178;
  undefined1 *local_170;
  undefined1 *local_168;
  char *local_160;
  char *local_158;
  undefined1 *local_150;
  undefined1 *local_148;
  char *local_140;
  char *local_138;
  undefined1 *local_130;
  undefined1 *local_128;
  char *local_120;
  char *local_118;
  char *local_110;
  char *local_108;
  undefined1 *local_100;
  undefined1 *local_f8;
  char *local_f0;
  char *local_e8;
  undefined1 *local_e0;
  undefined1 *local_d8;
  char *local_d0;
  char *local_c8;
  undefined1 *local_c0;
  undefined1 *local_b8;
  char *local_b0;
  char *local_a8;
  char *local_a0;
  char *local_98;
  undefined1 *local_90;
  undefined1 *local_88;
  char *local_80;
  char *local_78;
  undefined1 *local_70;
  undefined1 *local_68;
  char *local_60;
  char *local_58;
  undefined1 *local_50;
  undefined1 *local_48;
  char *local_40;
  char *local_38;
  
  local_200 = rows;
  build_rows<Gudhi::persistence_matrix::Intrusive_list_column<Column_mini_matrix<Chain_col_options<false,(Gudhi::persistence_matrix::Column_types)7,true,true,true>>>>
            ();
  get_ordered_rows<Gudhi::persistence_matrix::Intrusive_list_column<Column_mini_matrix<Chain_col_options<false,(Gudhi::persistence_matrix::Column_types)7,true,true,true>>>>
            ((vector<std::set<std::pair<unsigned_int,_unsigned_int>,_std::less<std::pair<unsigned_int,_unsigned_int>_>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>,_std::allocator<std::set<std::pair<unsigned_int,_unsigned_int>,_std::less<std::pair<unsigned_int,_unsigned_int>_>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>_>_>
              *)local_1b8,matrix);
  test_matrix_equality<Gudhi::persistence_matrix::Intrusive_list_column<Column_mini_matrix<Chain_col_options<false,(Gudhi::persistence_matrix::Column_types)7,true,true,true>>>>
            ((vector<std::vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>,_std::allocator<std::vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>_>_>
              *)local_1f8,
             (vector<std::set<std::pair<unsigned_int,_unsigned_int>,_std::less<std::pair<unsigned_int,_unsigned_int>_>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>,_std::allocator<std::set<std::pair<unsigned_int,_unsigned_int>,_std::less<std::pair<unsigned_int,_unsigned_int>_>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>_>_>
              *)local_1b8);
  std::
  vector<std::set<std::pair<unsigned_int,_unsigned_int>,_std::less<std::pair<unsigned_int,_unsigned_int>_>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>,_std::allocator<std::set<std::pair<unsigned_int,_unsigned_int>,_std::less<std::pair<unsigned_int,_unsigned_int>_>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>_>_>
  ::~vector((vector<std::set<std::pair<unsigned_int,_unsigned_int>,_std::less<std::pair<unsigned_int,_unsigned_int>_>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>,_std::allocator<std::set<std::pair<unsigned_int,_unsigned_int>,_std::less<std::pair<unsigned_int,_unsigned_int>_>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>_>_>
             *)local_1b8);
  std::
  vector<std::vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>,_std::allocator<std::vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>_>_>
  ::~vector((vector<std::vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>,_std::allocator<std::vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>_>_>
             *)local_1f8);
  build_column_values<Gudhi::persistence_matrix::Intrusive_list_column<Column_mini_matrix<Chain_col_options<false,(Gudhi::persistence_matrix::Column_types)7,true,true,true>>>>
            ();
  get_ordered_column_contents<Gudhi::persistence_matrix::Intrusive_list_column<Column_mini_matrix<Chain_col_options<false,(Gudhi::persistence_matrix::Column_types)7,true,true,true>>>>
            ((vector<std::set<std::pair<unsigned_int,_unsigned_int>,_std::less<std::pair<unsigned_int,_unsigned_int>_>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>,_std::allocator<std::set<std::pair<unsigned_int,_unsigned_int>,_std::less<std::pair<unsigned_int,_unsigned_int>_>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>_>_>
              *)local_1b8,matrix);
  test_matrix_equality<Gudhi::persistence_matrix::Intrusive_list_column<Column_mini_matrix<Chain_col_options<false,(Gudhi::persistence_matrix::Column_types)7,true,true,true>>>>
            ((vector<std::vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>,_std::allocator<std::vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>_>_>
              *)local_1f8,
             (vector<std::set<std::pair<unsigned_int,_unsigned_int>,_std::less<std::pair<unsigned_int,_unsigned_int>_>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>,_std::allocator<std::set<std::pair<unsigned_int,_unsigned_int>,_std::less<std::pair<unsigned_int,_unsigned_int>_>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>_>_>
              *)local_1b8);
  std::
  vector<std::set<std::pair<unsigned_int,_unsigned_int>,_std::less<std::pair<unsigned_int,_unsigned_int>_>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>,_std::allocator<std::set<std::pair<unsigned_int,_unsigned_int>,_std::less<std::pair<unsigned_int,_unsigned_int>_>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>_>_>
  ::~vector((vector<std::set<std::pair<unsigned_int,_unsigned_int>,_std::less<std::pair<unsigned_int,_unsigned_int>_>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>,_std::allocator<std::set<std::pair<unsigned_int,_unsigned_int>,_std::less<std::pair<unsigned_int,_unsigned_int>_>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>_>_>
             *)local_1b8);
  std::
  vector<std::vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>,_std::allocator<std::vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>_>_>
  ::~vector((vector<std::vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>,_std::allocator<std::vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>_>_>
             *)local_1f8);
  pIVar5 = (matrix->
           super__Vector_base<Gudhi::persistence_matrix::Intrusive_list_column<Column_mini_matrix<Chain_col_options<false,_(Gudhi::persistence_matrix::Column_types)7,_true,_true,_true>_>_>,_std::allocator<Gudhi::persistence_matrix::Intrusive_list_column<Column_mini_matrix<Chain_col_options<false,_(Gudhi::persistence_matrix::Column_types)7,_true,_true,_true>_>_>_>_>
           )._M_impl.super__Vector_impl_data._M_start;
  local_1f8._0_4_ = 6;
  local_1f8._8_8_ = local_200;
  p_Stack_1e8 = *(_Base_ptr *)&pIVar5->super_Column_dimension_option;
  local_1e0 = (pIVar5->super_Chain_column_option).pairedColumn_;
  local_1d8 = (_Base_ptr)pIVar5->operators_;
  pEStack_1d0 = pIVar5->entryPool_;
  plVar16 = *(long **)&(pIVar5->column_).super_type.data_.root_plus_size_;
  local_1c8.next_ = &local_1c8;
  local_1c8.prev_ = &local_1c8;
  local_178 = matrix;
  if ((Column_support *)plVar16 != &pIVar5->column_) {
    do {
      IVar2 = *(ID_index *)(plVar16 + 2);
      value = (reference)operator_new(0x30);
      (value->super_Entry_column_index_option).columnIndex_ = local_1f8._0_4_;
      (value->super_Row_hook).super_type.super_type.super_list_node<void_*>.next_ = (node_ptr)0x0;
      (value->super_Row_hook).super_type.super_type.super_list_node<void_*>.prev_ = (node_ptr)0x0;
      value->rowIndex_ = IVar2;
      (value->super_Entry_field_element_option).element_ = *(uint *)((long)plVar16 + -0x14);
      (value->super_Column_hook).super_type.super_type.super_list_node<void_*>.prev_ =
           local_1c8.prev_;
      (value->super_Column_hook).super_type.super_type.super_list_node<void_*>.next_ = &local_1c8;
      pplVar8 = &(local_1c8.prev_)->next_;
      local_1c8.prev_ = (node_ptr)&value->super_Column_hook;
      *pplVar8 = (node_ptr)&value->super_Column_hook;
      local_1b8._0_4_ = IVar2;
      if ((map<unsigned_int,_boost::intrusive::list<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Chain_col_options<false,_(Gudhi::persistence_matrix::Column_types)7,_true,_true,_true>_>_>,_boost::intrusive::constant_time_size<false>,_boost::intrusive::base_hook<boost::intrusive::list_base_hook<boost::intrusive::tag<Column_mini_matrix<Chain_col_options<false,_(Gudhi::persistence_matrix::Column_types)7,_true,_true,_true>_>::Matrix_row_tag>,_boost::intrusive::link_mode<(boost::intrusive::link_mode_type)2>_>_>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_boost::intrusive::list<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Chain_col_options<false,_(Gudhi::persistence_matrix::Column_types)7,_true,_true,_true>_>_>,_boost::intrusive::constant_time_size<false>,_boost::intrusive::base_hook<boost::intrusive::list_base_hook<boost::intrusive::tag<Column_mini_matrix<Chain_col_options<false,_(Gudhi::persistence_matrix::Column_types)7,_true,_true,_true>_>::Matrix_row_tag>,_boost::intrusive::link_mode<(boost::intrusive::link_mode_type)2>_>_>_>_>_>_>
           *)local_1f8._8_8_ !=
          (map<unsigned_int,_boost::intrusive::list<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Chain_col_options<false,_(Gudhi::persistence_matrix::Column_types)7,_true,_true,_true>_>_>,_boost::intrusive::constant_time_size<false>,_boost::intrusive::base_hook<boost::intrusive::list_base_hook<boost::intrusive::tag<Column_mini_matrix<Chain_col_options<false,_(Gudhi::persistence_matrix::Column_types)7,_true,_true,_true>_>::Matrix_row_tag>,_boost::intrusive::link_mode<(boost::intrusive::link_mode_type)2>_>_>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_boost::intrusive::list<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Chain_col_options<false,_(Gudhi::persistence_matrix::Column_types)7,_true,_true,_true>_>_>,_boost::intrusive::constant_time_size<false>,_boost::intrusive::base_hook<boost::intrusive::list_base_hook<boost::intrusive::tag<Column_mini_matrix<Chain_col_options<false,_(Gudhi::persistence_matrix::Column_types)7,_true,_true,_true>_>::Matrix_row_tag>,_boost::intrusive::link_mode<(boost::intrusive::link_mode_type)2>_>_>_>_>_>_>
           *)0x0) {
        this = &std::
                map<unsigned_int,_boost::intrusive::list<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Chain_col_options<false,_(Gudhi::persistence_matrix::Column_types)7,_true,_true,_true>_>_>,_boost::intrusive::constant_time_size<false>,_boost::intrusive::base_hook<boost::intrusive::list_base_hook<boost::intrusive::tag<Column_mini_matrix<Chain_col_options<false,_(Gudhi::persistence_matrix::Column_types)7,_true,_true,_true>_>::Matrix_row_tag>,_boost::intrusive::link_mode<(boost::intrusive::link_mode_type)2>_>_>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_boost::intrusive::list<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Chain_col_options<false,_(Gudhi::persistence_matrix::Column_types)7,_true,_true,_true>_>_>,_boost::intrusive::constant_time_size<false>,_boost::intrusive::base_hook<boost::intrusive::list_base_hook<boost::intrusive::tag<Column_mini_matrix<Chain_col_options<false,_(Gudhi::persistence_matrix::Column_types)7,_true,_true,_true>_>::Matrix_row_tag>,_boost::intrusive::link_mode<(boost::intrusive::link_mode_type)2>_>_>_>_>_>_>
                ::operator[]((map<unsigned_int,_boost::intrusive::list<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Chain_col_options<false,_(Gudhi::persistence_matrix::Column_types)7,_true,_true,_true>_>_>,_boost::intrusive::constant_time_size<false>,_boost::intrusive::base_hook<boost::intrusive::list_base_hook<boost::intrusive::tag<Column_mini_matrix<Chain_col_options<false,_(Gudhi::persistence_matrix::Column_types)7,_true,_true,_true>_>::Matrix_row_tag>,_boost::intrusive::link_mode<(boost::intrusive::link_mode_type)2>_>_>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_boost::intrusive::list<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Chain_col_options<false,_(Gudhi::persistence_matrix::Column_types)7,_true,_true,_true>_>_>,_boost::intrusive::constant_time_size<false>,_boost::intrusive::base_hook<boost::intrusive::list_base_hook<boost::intrusive::tag<Column_mini_matrix<Chain_col_options<false,_(Gudhi::persistence_matrix::Column_types)7,_true,_true,_true>_>::Matrix_row_tag>,_boost::intrusive::link_mode<(boost::intrusive::link_mode_type)2>_>_>_>_>_>_>
                              *)local_1f8._8_8_,(key_type *)local_1b8)->super_type;
        boost::intrusive::
        list_impl<boost::intrusive::bhtraits<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Chain_col_options<false,_(Gudhi::persistence_matrix::Column_types)7,_true,_true,_true>_>_>,_boost::intrusive::list_node_traits<void_*>,_(boost::intrusive::link_mode_type)2,_Column_mini_matrix<Chain_col_options<false,_(Gudhi::persistence_matrix::Column_types)7,_true,_true,_true>_>::Matrix_row_tag,_1U>,_unsigned_long,_false,_void>
        ::push_back(this,value);
      }
      plVar16 = (long *)*plVar16;
    } while ((Column_support *)plVar16 != &pIVar5->column_);
  }
  p_Var1 = &(local_200->_M_t)._M_impl.super__Rb_tree_header;
  p_Var13 = (local_200->_M_t)._M_impl.super__Rb_tree_header._M_header._M_left;
  uVar9 = local_1f8._0_4_;
  p_Var6 = p_Stack_1e8;
  IVar10 = local_1e0;
  local_198 = local_1d8;
  pEStack_190 = pEStack_1d0;
  while ((_Rb_tree_header *)p_Var13 != p_Var1) {
    local_1f8._0_4_ = uVar9;
    p_Stack_1e8 = p_Var6;
    local_1e0 = IVar10;
    local_1d8 = local_198;
    pEStack_1d0 = pEStack_190;
    if (p_Var13[1]._M_parent != (_Base_ptr)&p_Var13[1]._M_parent &&
        p_Var13[1]._M_parent != (_Base_ptr)0x0) {
      p_Var6 = p_Var13[1]._M_left;
      _Var3 = p_Var6[1]._M_color;
      if ((_Var3 < 6) && ((0x2bU >> (_Var3 & 0x1f) & 1) != 0)) {
        local_120 = 
        "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_column_tests.h"
        ;
        local_118 = "";
        local_130 = &boost::unit_test::basic_cstring<char_const>::null;
        local_128 = &boost::unit_test::basic_cstring<char_const>::null;
        boost::unit_test::unit_test_log_t::set_checkpoint
                  (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_120,0x20d);
        local_260 = local_260 & 0xffffffffffffff00;
        local_268 = &PTR__lazy_ostream_001fb428;
        sStack_258.pi_ = (sp_counted_base *)&boost::unit_test::lazy_ostream::inst;
        local_250 = (undefined4 **)0x1c2304;
        iVar4 = *(int *)&p_Var6[-1]._M_right;
        local_298 = (undefined4 *)CONCAT44(local_298._4_4_,iVar4);
        local_2a0 = (undefined *)CONCAT44(local_2a0._4_4_,6);
        local_288 = (undefined **)CONCAT71(local_288._1_7_,iVar4 == 6);
        local_280 = (char *)0x0;
        sStack_278.pi_ = (sp_counted_base *)0x0;
        local_228 = 
        "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_column_tests.h"
        ;
        local_220 = "";
        local_210 = &local_298;
        local_1b8._8_8_ = local_1b8._8_8_ & 0xffffffffffffff00;
        local_1b8._0_8_ = &PTR__lazy_ostream_001fb8e8;
        local_1b8._16_8_ = &boost::unit_test::lazy_ostream::inst;
        local_1a0 = &local_210;
        local_290 = &local_2a0;
        local_240 = 0;
        local_248.col_ =
             (Intrusive_list_column<Column_mini_matrix<Chain_col_options<false,_(Gudhi::persistence_matrix::Column_types)7,_true,_true,_true>_>_>
              *)&PTR__lazy_ostream_001fb928;
        local_238 = &boost::unit_test::lazy_ostream::inst;
        local_230 = &local_290;
        boost::test_tools::tt_detail::report_assertion
                  (&local_288,&local_268,&local_228,0x20d,1,2,2,"entry.get_column_index()",local_1b8
                   ,"6",&local_248);
        boost::detail::shared_count::~shared_count(&sStack_278);
      }
    }
    p_Var13 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var13);
    uVar9 = local_1f8._0_4_;
    p_Var6 = p_Stack_1e8;
    IVar10 = local_1e0;
    local_198 = local_1d8;
    pEStack_190 = pEStack_1d0;
  }
  local_1f8._0_4_ = 0;
  local_188.next_ = &local_188;
  local_1b8._4_4_ = (undefined4)((ulong)local_1b8._0_8_ >> 0x20);
  local_1b8._0_4_ = uVar9;
  p_Stack_1e8 = (_Base_ptr)0xffffffffffffffff;
  local_1e0 = 0xffffffff;
  uVar11 = (ulong)local_1a0 >> 0x20;
  local_1a0 = (undefined4 ***)CONCAT44((int)uVar11,IVar10);
  local_1d8 = (_Base_ptr)0x0;
  pEStack_1d0 = (Entry_constructor *)0x0;
  local_1b8._8_8_ = local_1f8._8_8_;
  local_1b8._16_8_ = p_Var6;
  local_188.prev_ = local_188.next_;
  boost::intrusive::circular_list_algorithms<boost::intrusive::list_node_traits<void_*>_>::
  swap_nodes(local_188.next_,&local_1c8);
  local_40 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_column_tests.h"
  ;
  local_38 = "";
  local_50 = &boost::unit_test::basic_cstring<char_const>::null;
  local_48 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_40,0x21c);
  local_280 = (char *)((ulong)local_280 & 0xffffffffffffff00);
  local_288 = &PTR__lazy_ostream_001fb428;
  sStack_278.pi_ = (sp_counted_base *)&boost::unit_test::lazy_ostream::inst;
  local_270 = "";
  local_2a0 = (undefined *)0xffffffffffffffff;
  plVar15 = &local_188;
  do {
    plVar15 = plVar15->next_;
    local_2a0 = local_2a0 + 1;
  } while (plVar15 != &local_188);
  local_290 = &local_2a0;
  local_298 = &local_2a4;
  local_2a4 = 4;
  local_220 = (char *)0x0;
  sStack_218.pi_ = (sp_counted_base *)0x0;
  local_210 = (undefined4 **)0x1c2a63;
  local_208 = "";
  local_230 = &local_290;
  local_240 = 0;
  local_248.col_ =
       (Intrusive_list_column<Column_mini_matrix<Chain_col_options<false,_(Gudhi::persistence_matrix::Column_types)7,_true,_true,_true>_>_>
        *)&PTR__lazy_ostream_001fb3e8;
  local_238 = &boost::unit_test::lazy_ostream::inst;
  local_250 = &local_298;
  local_260 = local_260 & 0xffffffffffffff00;
  local_268 = &PTR__lazy_ostream_001fb928;
  sStack_258.pi_ = (sp_counted_base *)&boost::unit_test::lazy_ostream::inst;
  local_228._0_1_ = local_2a0 == (undefined *)0x4;
  boost::test_tools::tt_detail::report_assertion
            (&local_228,&local_288,&local_210,0x21c,1,2,2,"moveCol.size()",&local_248,"4",&local_268
            );
  boost::detail::shared_count::~shared_count(&sStack_218);
  local_60 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_column_tests.h"
  ;
  local_58 = "";
  local_70 = &boost::unit_test::basic_cstring<char_const>::null;
  local_68 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_60,0x21d);
  local_280 = (char *)((ulong)local_280 & 0xffffffffffffff00);
  local_288 = &PTR__lazy_ostream_001fb428;
  sStack_278.pi_ = (sp_counted_base *)&boost::unit_test::lazy_ostream::inst;
  local_270 = "";
  lVar14 = 1;
  plVar15 = &local_1c8;
  do {
    plVar15 = plVar15->next_;
    lVar14 = lVar14 + -1;
  } while (plVar15 != &local_1c8);
  local_2a0 = (undefined *)-lVar14;
  local_2a4 = 0;
  local_228 = (char *)CONCAT71(local_228._1_7_,lVar14 == 0);
  local_220 = (char *)0x0;
  sStack_218.pi_ = (sp_counted_base *)0x0;
  local_210 = (undefined4 **)0x1c2a63;
  local_208 = "";
  local_290 = &local_2a0;
  local_240 = 0;
  local_248.col_ =
       (Intrusive_list_column<Column_mini_matrix<Chain_col_options<false,_(Gudhi::persistence_matrix::Column_types)7,_true,_true,_true>_>_>
        *)&PTR__lazy_ostream_001fb3e8;
  local_238 = &boost::unit_test::lazy_ostream::inst;
  local_230 = &local_290;
  local_298 = &local_2a4;
  local_260 = local_260 & 0xffffffffffffff00;
  local_268 = &PTR__lazy_ostream_001fb928;
  sStack_258.pi_ = (sp_counted_base *)&boost::unit_test::lazy_ostream::inst;
  local_250 = &local_298;
  boost::test_tools::tt_detail::report_assertion
            (&local_228,&local_288,&local_210,0x21d,1,2,2,"col.size()",&local_248,"0",&local_268);
  boost::detail::shared_count::~shared_count(&sStack_218);
  local_80 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_column_tests.h"
  ;
  local_78 = "";
  local_90 = &boost::unit_test::basic_cstring<char_const>::null;
  local_88 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_80,0x21e);
  bVar12 = Gudhi::persistence_matrix::operator==
                     ((local_178->
                      super__Vector_base<Gudhi::persistence_matrix::Intrusive_list_column<Column_mini_matrix<Chain_col_options<false,_(Gudhi::persistence_matrix::Column_types)7,_true,_true,_true>_>_>,_std::allocator<Gudhi::persistence_matrix::Intrusive_list_column<Column_mini_matrix<Chain_col_options<false,_(Gudhi::persistence_matrix::Column_types)7,_true,_true,_true>_>_>_>_>
                      )._M_impl.super__Vector_impl_data._M_start,
                      (Intrusive_list_column<Column_mini_matrix<Chain_col_options<false,_(Gudhi::persistence_matrix::Column_types)7,_true,_true,_true>_>_>
                       *)local_1b8);
  local_268 = (undefined **)CONCAT71(local_268._1_7_,bVar12);
  local_260 = 0;
  sStack_258.pi_ = (sp_counted_base *)0x0;
  local_288 = (undefined **)0x1ccbc9;
  local_280 = "";
  local_240 = 0;
  local_248.col_ =
       (Intrusive_list_column<Column_mini_matrix<Chain_col_options<false,_(Gudhi::persistence_matrix::Column_types)7,_true,_true,_true>_>_>
        *)&PTR__lazy_ostream_001fb398;
  local_238 = &boost::unit_test::lazy_ostream::inst;
  local_230 = &local_288;
  local_a0 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_column_tests.h"
  ;
  local_98 = "";
  boost::test_tools::tt_detail::report_assertion();
  boost::detail::shared_count::~shared_count(&sStack_258);
  for (p_Var13 = (local_200->_M_t)._M_impl.super__Rb_tree_header._M_header._M_left;
      (_Rb_tree_header *)p_Var13 != p_Var1;
      p_Var13 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var13)) {
    if (p_Var13[1]._M_parent != (_Base_ptr)&p_Var13[1]._M_parent &&
        p_Var13[1]._M_parent != (_Base_ptr)0x0) {
      p_Var6 = p_Var13[1]._M_left;
      _Var3 = p_Var6[1]._M_color;
      if ((_Var3 < 6) && ((0x2bU >> (_Var3 & 0x1f) & 1) != 0)) {
        local_140 = 
        "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_column_tests.h"
        ;
        local_138 = "";
        local_150 = &boost::unit_test::basic_cstring<char_const>::null;
        local_148 = &boost::unit_test::basic_cstring<char_const>::null;
        boost::unit_test::unit_test_log_t::set_checkpoint
                  (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_140,0x225,
                   &local_150);
        local_280 = (char *)((ulong)local_280 & 0xffffffffffffff00);
        local_288 = &PTR__lazy_ostream_001fb428;
        sStack_278.pi_ = (sp_counted_base *)&boost::unit_test::lazy_ostream::inst;
        local_270 = "";
        iVar4 = *(int *)&p_Var6[-1]._M_right;
        local_2a0 = (undefined *)CONCAT44(local_2a0._4_4_,iVar4);
        local_2a4 = 6;
        local_228 = (char *)CONCAT71(local_228._1_7_,iVar4 == 6);
        local_220 = (char *)0x0;
        sStack_218.pi_ = (sp_counted_base *)0x0;
        local_210 = (undefined4 **)0x1c2a63;
        local_208 = "";
        local_290 = &local_2a0;
        local_240 = 0;
        local_248.col_ =
             (Intrusive_list_column<Column_mini_matrix<Chain_col_options<false,_(Gudhi::persistence_matrix::Column_types)7,_true,_true,_true>_>_>
              *)&PTR__lazy_ostream_001fb8e8;
        local_238 = &boost::unit_test::lazy_ostream::inst;
        local_230 = &local_290;
        local_298 = &local_2a4;
        local_260 = local_260 & 0xffffffffffffff00;
        local_268 = &PTR__lazy_ostream_001fb928;
        sStack_258.pi_ = (sp_counted_base *)&boost::unit_test::lazy_ostream::inst;
        local_250 = &local_298;
        boost::test_tools::tt_detail::report_assertion
                  (&local_228,&local_288,&local_210,0x225,1,2,2,"entry.get_column_index()",
                   &local_248,"6",&local_268);
        boost::detail::shared_count::~shared_count(&sStack_218);
      }
    }
  }
  Gudhi::persistence_matrix::swap
            ((Intrusive_list_column<Column_mini_matrix<Chain_col_options<false,_(Gudhi::persistence_matrix::Column_types)7,_true,_true,_true>_>_>
              *)local_1f8,
             (Intrusive_list_column<Column_mini_matrix<Chain_col_options<false,_(Gudhi::persistence_matrix::Column_types)7,_true,_true,_true>_>_>
              *)local_1b8);
  local_b0 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_column_tests.h"
  ;
  local_a8 = "";
  local_c0 = &boost::unit_test::basic_cstring<char_const>::null;
  local_b8 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_b0,0x234);
  local_280 = (char *)((ulong)local_280 & 0xffffffffffffff00);
  local_288 = &PTR__lazy_ostream_001fb428;
  sStack_278.pi_ = (sp_counted_base *)&boost::unit_test::lazy_ostream::inst;
  local_270 = "";
  lVar14 = 1;
  plVar15 = &local_188;
  do {
    plVar15 = plVar15->next_;
    lVar14 = lVar14 + -1;
  } while (plVar15 != &local_188);
  local_2a0 = (undefined *)-lVar14;
  local_2a4 = 0;
  local_220 = (char *)0x0;
  sStack_218.pi_ = (sp_counted_base *)0x0;
  local_210 = (undefined4 **)0x1c2a63;
  local_208 = "";
  local_290 = &local_2a0;
  local_240 = 0;
  local_248.col_ =
       (Intrusive_list_column<Column_mini_matrix<Chain_col_options<false,_(Gudhi::persistence_matrix::Column_types)7,_true,_true,_true>_>_>
        *)&PTR__lazy_ostream_001fb3e8;
  local_238 = &boost::unit_test::lazy_ostream::inst;
  local_230 = &local_290;
  local_298 = &local_2a4;
  local_260 = local_260 & 0xffffffffffffff00;
  local_268 = &PTR__lazy_ostream_001fb928;
  sStack_258.pi_ = (sp_counted_base *)&boost::unit_test::lazy_ostream::inst;
  local_250 = &local_298;
  local_228._0_1_ = lVar14 == 0;
  boost::test_tools::tt_detail::report_assertion
            (&local_228,&local_288,&local_210,0x234,1,2,2,"moveCol.size()",&local_248,"0",&local_268
            );
  boost::detail::shared_count::~shared_count(&sStack_218);
  local_d0 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_column_tests.h"
  ;
  local_c8 = "";
  local_e0 = &boost::unit_test::basic_cstring<char_const>::null;
  local_d8 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_d0,0x235);
  local_280 = (char *)((ulong)local_280 & 0xffffffffffffff00);
  local_288 = &PTR__lazy_ostream_001fb428;
  sStack_278.pi_ = (sp_counted_base *)&boost::unit_test::lazy_ostream::inst;
  local_270 = "";
  local_2a0 = (undefined *)0xffffffffffffffff;
  plVar15 = &local_1c8;
  do {
    plVar15 = plVar15->next_;
    local_2a0 = local_2a0 + 1;
  } while (plVar15 != &local_1c8);
  local_2a4 = 4;
  local_228 = (char *)CONCAT71(local_228._1_7_,local_2a0 == (undefined *)0x4);
  local_220 = (char *)0x0;
  sStack_218.pi_ = (sp_counted_base *)0x0;
  local_210 = (undefined4 **)0x1c2a63;
  local_208 = "";
  local_290 = &local_2a0;
  local_240 = 0;
  local_248.col_ =
       (Intrusive_list_column<Column_mini_matrix<Chain_col_options<false,_(Gudhi::persistence_matrix::Column_types)7,_true,_true,_true>_>_>
        *)&PTR__lazy_ostream_001fb3e8;
  local_238 = &boost::unit_test::lazy_ostream::inst;
  local_230 = &local_290;
  local_298 = &local_2a4;
  local_260 = local_260 & 0xffffffffffffff00;
  local_268 = &PTR__lazy_ostream_001fb928;
  sStack_258.pi_ = (sp_counted_base *)&boost::unit_test::lazy_ostream::inst;
  local_250 = &local_298;
  boost::test_tools::tt_detail::report_assertion
            (&local_228,&local_288,&local_210,0x235,1,2,2,"col.size()",&local_248,"4",&local_268);
  boost::detail::shared_count::~shared_count(&sStack_218);
  local_f0 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_column_tests.h"
  ;
  local_e8 = "";
  local_100 = &boost::unit_test::basic_cstring<char_const>::null;
  local_f8 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_f0,0x236);
  bVar12 = Gudhi::persistence_matrix::operator==
                     ((local_178->
                      super__Vector_base<Gudhi::persistence_matrix::Intrusive_list_column<Column_mini_matrix<Chain_col_options<false,_(Gudhi::persistence_matrix::Column_types)7,_true,_true,_true>_>_>,_std::allocator<Gudhi::persistence_matrix::Intrusive_list_column<Column_mini_matrix<Chain_col_options<false,_(Gudhi::persistence_matrix::Column_types)7,_true,_true,_true>_>_>_>_>
                      )._M_impl.super__Vector_impl_data._M_start,
                      (Intrusive_list_column<Column_mini_matrix<Chain_col_options<false,_(Gudhi::persistence_matrix::Column_types)7,_true,_true,_true>_>_>
                       *)local_1f8);
  local_268 = (undefined **)CONCAT71(local_268._1_7_,bVar12);
  local_260 = 0;
  sStack_258.pi_ = (sp_counted_base *)0x0;
  local_288 = (undefined **)0x1ccbde;
  local_280 = "";
  local_240 = 0;
  local_248.col_ =
       (Intrusive_list_column<Column_mini_matrix<Chain_col_options<false,_(Gudhi::persistence_matrix::Column_types)7,_true,_true,_true>_>_>
        *)&PTR__lazy_ostream_001fb398;
  local_238 = &boost::unit_test::lazy_ostream::inst;
  local_110 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_column_tests.h"
  ;
  local_108 = "";
  local_230 = &local_288;
  boost::test_tools::tt_detail::report_assertion();
  boost::detail::shared_count::~shared_count(&sStack_258);
  for (p_Var13 = (local_200->_M_t)._M_impl.super__Rb_tree_header._M_header._M_left;
      (_Rb_tree_header *)p_Var13 != p_Var1;
      p_Var13 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var13)) {
    if (p_Var13[1]._M_parent != (_Base_ptr)&p_Var13[1]._M_parent &&
        p_Var13[1]._M_parent != (_Base_ptr)0x0) {
      p_Var6 = p_Var13[1]._M_left;
      _Var3 = p_Var6[1]._M_color;
      if ((_Var3 < 6) && ((0x2bU >> (_Var3 & 0x1f) & 1) != 0)) {
        local_160 = 
        "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_column_tests.h"
        ;
        local_158 = "";
        local_170 = &boost::unit_test::basic_cstring<char_const>::null;
        local_168 = &boost::unit_test::basic_cstring<char_const>::null;
        boost::unit_test::unit_test_log_t::set_checkpoint
                  (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_160,0x23d,
                   &local_170);
        local_280 = (char *)((ulong)local_280 & 0xffffffffffffff00);
        local_288 = &PTR__lazy_ostream_001fb428;
        sStack_278.pi_ = (sp_counted_base *)&boost::unit_test::lazy_ostream::inst;
        local_270 = "";
        iVar4 = *(int *)&p_Var6[-1]._M_right;
        local_2a0 = (undefined *)CONCAT44(local_2a0._4_4_,iVar4);
        local_2a4 = 6;
        local_228 = (char *)CONCAT71(local_228._1_7_,iVar4 == 6);
        local_220 = (char *)0x0;
        sStack_218.pi_ = (sp_counted_base *)0x0;
        local_210 = (undefined4 **)0x1c2a63;
        local_208 = "";
        local_290 = &local_2a0;
        local_240 = 0;
        local_248.col_ =
             (Intrusive_list_column<Column_mini_matrix<Chain_col_options<false,_(Gudhi::persistence_matrix::Column_types)7,_true,_true,_true>_>_>
              *)&PTR__lazy_ostream_001fb8e8;
        local_238 = &boost::unit_test::lazy_ostream::inst;
        local_230 = &local_290;
        local_298 = &local_2a4;
        local_260 = local_260 & 0xffffffffffffff00;
        local_268 = &PTR__lazy_ostream_001fb928;
        sStack_258.pi_ = (sp_counted_base *)&boost::unit_test::lazy_ostream::inst;
        local_250 = &local_298;
        boost::test_tools::tt_detail::report_assertion
                  (&local_228,&local_288,&local_210,0x23d,1,2,2,"entry.get_column_index()",
                   &local_248,"6",&local_268);
        boost::detail::shared_count::~shared_count(&sStack_218);
      }
    }
  }
  local_248.col_ =
       (Intrusive_list_column<Column_mini_matrix<Chain_col_options<false,_(Gudhi::persistence_matrix::Column_types)7,_true,_true,_true>_>_>
        *)local_1b8;
  if (local_188.next_ != &local_188) {
    plVar17 = local_188.next_;
    do {
      plVar7 = plVar17->next_;
      plVar17->next_ = (node_ptr)0x0;
      plVar17->prev_ = (node_ptr)0x0;
      Gudhi::persistence_matrix::
      Intrusive_list_column<Column_mini_matrix<Chain_col_options<false,_(Gudhi::persistence_matrix::Column_types)7,_true,_true,_true>_>_>
      ::Delete_disposer::operator()(&local_248,(Entry *)&plVar17[-2].prev_);
      plVar17 = plVar7;
    } while (plVar7 != &local_188);
  }
  local_1b8._0_8_ = local_1f8;
  if (local_1c8.next_ != &local_1c8) {
    plVar15 = local_1c8.next_;
    do {
      plVar17 = plVar15->next_;
      plVar15->next_ = (node_ptr)0x0;
      plVar15->prev_ = (node_ptr)0x0;
      Gudhi::persistence_matrix::
      Intrusive_list_column<Column_mini_matrix<Chain_col_options<false,_(Gudhi::persistence_matrix::Column_types)7,_true,_true,_true>_>_>
      ::Delete_disposer::operator()((Delete_disposer *)local_1b8,(Entry *)&plVar15[-2].prev_);
      plVar15 = plVar17;
    } while (plVar17 != &local_1c8);
  }
  return;
}

Assistant:

void column_test_row_access_constructors(std::vector<Column>& matrix, Row_container& rows) {
  test_matrix_equality<Column>(build_rows<Column>(), get_ordered_rows(matrix));
  test_matrix_equality<Column>(build_column_values<Column>(), get_ordered_column_contents(matrix));

  Column col(matrix[0], 6, &rows);
  for (auto& r : rows) {
    if constexpr (Column::Master::Option_list::has_removable_rows) {
      if (!r.second.empty()) {
        auto& entry = *r.second.rbegin();
        if (entry.get_row_index() == 0 || entry.get_row_index() == 1 || entry.get_row_index() == 3 ||
            entry.get_row_index() == 5) {
          BOOST_CHECK_EQUAL(entry.get_column_index(), 6);
        }
      }
    } else {
      if (!r.empty()) {
        auto& entry = *r.rbegin();
        if (entry.get_row_index() == 0 || entry.get_row_index() == 1 || entry.get_row_index() == 3 ||
            entry.get_row_index() == 5) {
          BOOST_CHECK_EQUAL(entry.get_column_index(), 6);
        }
      }
    }
  }

  Column moveCol(std::move(col));
  BOOST_CHECK_EQUAL(moveCol.size(), 4);
  BOOST_CHECK_EQUAL(col.size(), 0);
  BOOST_CHECK(matrix[0] == moveCol);
  for (auto& r : rows) {
    if constexpr (Column::Master::Option_list::has_removable_rows) {
      if (!r.second.empty()) {
        auto& entry = *r.second.rbegin();
        if (entry.get_row_index() == 0 || entry.get_row_index() == 1 || entry.get_row_index() == 3 ||
            entry.get_row_index() == 5) {
          BOOST_CHECK_EQUAL(entry.get_column_index(), 6);
        }
      }
    } else {
      if (!r.empty()) {
        auto& entry = *r.rbegin();
        if (entry.get_row_index() == 0 || entry.get_row_index() == 1 || entry.get_row_index() == 3 ||
            entry.get_row_index() == 5) {
          BOOST_CHECK_EQUAL(entry.get_column_index(), 6);
        }
      }
    }
  }

  swap(col, moveCol);
  BOOST_CHECK_EQUAL(moveCol.size(), 0);
  BOOST_CHECK_EQUAL(col.size(), 4);
  BOOST_CHECK(matrix[0] == col);
  for (auto& r : rows) {
    if constexpr (Column::Master::Option_list::has_removable_rows) {
      if (!r.second.empty()) {
        auto& entry = *r.second.rbegin();
        if (entry.get_row_index() == 0 || entry.get_row_index() == 1 || entry.get_row_index() == 3 ||
            entry.get_row_index() == 5) {
          BOOST_CHECK_EQUAL(entry.get_column_index(), 6);
        }
      }
    } else {
      if (!r.empty()) {
        auto& entry = *r.rbegin();
        if (entry.get_row_index() == 0 || entry.get_row_index() == 1 || entry.get_row_index() == 3 ||
            entry.get_row_index() == 5) {
          BOOST_CHECK_EQUAL(entry.get_column_index(), 6);
        }
      }
    }
  }
}